

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::addBuildInSymbols(SemanticAnalyser *this)

{
  allocator<char> local_59;
  _Head_base<0UL,_Symbol_*,_false> local_58;
  _Head_base<0UL,_Symbol_*,_false> local_50;
  _Head_base<0UL,_Symbol_*,_false> local_48;
  _Head_base<0UL,_Symbol_*,_false> local_40;
  string local_38;
  
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::make_unique<FunctionSymbol,char_const(&)[3],TypeName>
            ((char (*) [3])&local_58,(TypeName *)"if");
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::push_back
            ((list<TypeName,_std::allocator<TypeName>_> *)(local_58._M_head_impl + 6),
             (value_type *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::push_back
            ((list<TypeName,_std::allocator<TypeName>_> *)(local_58._M_head_impl + 6),
             (value_type *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::push_back
            ((list<TypeName,_std::allocator<TypeName>_> *)(local_58._M_head_impl + 6),
             (value_type *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = 2;
  std::make_unique<FunctionSymbol,char_const(&)[6],TypeName>
            ((char (*) [6])&local_50,(TypeName *)"print");
  local_38._M_dataplus._M_p._0_4_ = 3;
  std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::push_back
            ((list<TypeName,_std::allocator<TypeName>_> *)(local_50._M_head_impl + 6),
             (value_type *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"if",&local_59);
  local_40._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (Symbol *)0x0;
  SymbolTable::addSymbol
            (&this->symbols_,&local_38,(unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_40
            );
  if (local_40._M_head_impl != (Symbol *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Symbol[1])();
  }
  local_40._M_head_impl = (Symbol *)0x0;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"print",&local_59);
  local_48._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Symbol *)0x0;
  SymbolTable::addSymbol
            (&this->symbols_,&local_38,(unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_48
            );
  if (local_48._M_head_impl != (Symbol *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Symbol[1])();
  }
  local_48._M_head_impl = (Symbol *)0x0;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_50._M_head_impl != (Symbol *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Symbol[1])();
  }
  if (local_58._M_head_impl != (Symbol *)0x0) {
    (*(local_58._M_head_impl)->_vptr_Symbol[1])();
  }
  return;
}

Assistant:

void SemanticAnalyser::addBuildInSymbols()
{
  auto ifSymbol = std::make_unique<FunctionSymbol>("if", TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);

  auto printSymbol = std::make_unique<FunctionSymbol>("print", TypeName::Void);
  printSymbol->addArgument(TypeName::String);

  symbols_.addSymbol("if", std::move(ifSymbol));
  symbols_.addSymbol("print", std::move(printSymbol));
}